

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportingbase.cpp
# Opt level: O1

void __thiscall trun::ResultsReportPinterBase::Begin(ResultsReportPinterBase *this)

{
  int iVar1;
  Config *pCVar2;
  FILE *pFVar3;
  
  pCVar2 = Config::Instance();
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&pCVar2->reportFile,"-");
  if (iVar1 == 0) {
    this->fout = _stdout;
  }
  else {
    pCVar2 = Config::Instance();
    pFVar3 = fopen((pCVar2->reportFile)._M_dataplus._M_p,"w+");
    this->fout = (FILE *)pFVar3;
    if (pFVar3 == (FILE *)0x0) {
      Begin((ResultsReportPinterBase *)&this->fout);
    }
  }
  return;
}

Assistant:

void ResultsReportPinterBase::Begin() {
    if (Config::Instance().reportFile == "-") {
        fout = stdout;
    } else {
#ifndef TRUN_EMBEDDED_MCU
        fout = fopen(Config::Instance().reportFile.c_str(), "w+");
        if (fout == nullptr) {
            fprintf(stderr, "Err: unable to create report file '%s'\n", Config::Instance().reportFile.c_str());
            fout = stdout;
        }
#else
        fout = stdout;
#endif
    }
}